

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::Colour::PayloadSize(Colour *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64_t uVar3;
  
  if (this->matrix_coefficients_ == 0xffffffffffffffff) {
    uVar1 = 0;
  }
  else {
    uVar1 = EbmlElementSize(0x55b1,this->matrix_coefficients_);
  }
  if (this->bits_per_channel_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b2,this->bits_per_channel_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->chroma_subsampling_horz_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b3,this->chroma_subsampling_horz_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->chroma_subsampling_vert_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b4,this->chroma_subsampling_vert_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->cb_subsampling_horz_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b5,this->cb_subsampling_horz_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->cb_subsampling_vert_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b6,this->cb_subsampling_vert_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->chroma_siting_horz_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b7,this->chroma_siting_horz_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->chroma_siting_vert_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b8,this->chroma_siting_vert_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->range_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55b9,this->range_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->transfer_characteristics_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55ba,this->transfer_characteristics_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->primaries_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55bb,this->primaries_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->max_cll_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55bc,this->max_cll_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->max_fall_ != 0xffffffffffffffff) {
    uVar2 = EbmlElementSize(0x55bd,this->max_fall_);
    uVar1 = uVar1 + uVar2;
  }
  if (this->mastering_metadata_ != (MasteringMetadata *)0x0) {
    uVar3 = MasteringMetadata::MasteringMetadataSize(this->mastering_metadata_);
    uVar1 = uVar1 + uVar3;
  }
  return uVar1;
}

Assistant:

uint64_t Colour::PayloadSize() const {
  uint64_t size = 0;

  if (matrix_coefficients_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvMatrixCoefficients,
                            static_cast<uint64>(matrix_coefficients_));
  }
  if (bits_per_channel_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvBitsPerChannel,
                            static_cast<uint64>(bits_per_channel_));
  }
  if (chroma_subsampling_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSubsamplingHorz,
                            static_cast<uint64>(chroma_subsampling_horz_));
  }
  if (chroma_subsampling_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSubsamplingVert,
                            static_cast<uint64>(chroma_subsampling_vert_));
  }
  if (cb_subsampling_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvCbSubsamplingHorz,
                            static_cast<uint64>(cb_subsampling_horz_));
  }
  if (cb_subsampling_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvCbSubsamplingVert,
                            static_cast<uint64>(cb_subsampling_vert_));
  }
  if (chroma_siting_horz_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSitingHorz,
                            static_cast<uint64>(chroma_siting_horz_));
  }
  if (chroma_siting_vert_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvChromaSitingVert,
                            static_cast<uint64>(chroma_siting_vert_));
  }
  if (range_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvRange, static_cast<uint64>(range_));
  }
  if (transfer_characteristics_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvTransferCharacteristics,
                            static_cast<uint64>(transfer_characteristics_));
  }
  if (primaries_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvPrimaries,
                            static_cast<uint64>(primaries_));
  }
  if (max_cll_ != kValueNotPresent) {
    size += EbmlElementSize(libwebm::kMkvMaxCLL, static_cast<uint64>(max_cll_));
  }
  if (max_fall_ != kValueNotPresent) {
    size +=
        EbmlElementSize(libwebm::kMkvMaxFALL, static_cast<uint64>(max_fall_));
  }

  if (mastering_metadata_)
    size += mastering_metadata_->MasteringMetadataSize();

  return size;
}